

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

void pybind11::detail::clear_patients(PyObject *self)

{
  PyObject *op;
  bool bVar1;
  pointer ppVar2;
  reference pp_Var3;
  PyObject *_py_tmp;
  PyObject **patient;
  iterator __end2;
  iterator __begin2;
  type *__range2;
  undefined1 local_48 [8];
  type patients;
  _Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
  local_28;
  iterator pos;
  internals *internals;
  instance *instance;
  PyObject *self_local;
  
  instance = (instance *)self;
  pos.
  super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
             )get_internals();
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const__object_*,_std::vector<_object_*,_std::allocator<_object_*>_>,_std::hash<const__object_*>,_std::equal_to<const__object_*>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>_>
       ::find((unordered_map<const__object_*,_std::vector<_object_*,_std::allocator<_object_*>_>,_std::hash<const__object_*>,_std::equal_to<const__object_*>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>_>
               *)((long)pos.
                        super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                        ._M_cur + 0x118),(key_type *)&instance);
  patients.super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       (pointer)std::
                unordered_map<const__object_*,_std::vector<_object_*,_std::allocator<_object_*>_>,_std::hash<const__object_*>,_std::equal_to<const__object_*>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>_>
                ::end((unordered_map<const__object_*,_std::vector<_object_*,_std::allocator<_object_*>_>,_std::hash<const__object_*>,_std::equal_to<const__object_*>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>_>
                       *)((long)pos.
                                super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                                ._M_cur + 0x118));
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                      *)&patients.super__Vector_base<_object_*,_std::allocator<_object_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    __assert_fail("pos != internals.patients.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/pybind11/include/pybind11/detail/class.h"
                  ,0x12e,"void pybind11::detail::clear_patients(PyObject *)");
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false,_false>
                         *)&local_28);
  std::vector<_object_*,_std::allocator<_object_*>_>::vector
            ((vector<_object_*,_std::allocator<_object_*>_> *)local_48,&ppVar2->second);
  std::
  unordered_map<const__object_*,_std::vector<_object_*,_std::allocator<_object_*>_>,_std::hash<const__object_*>,_std::equal_to<const__object_*>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>_>
  ::erase((unordered_map<const__object_*,_std::vector<_object_*,_std::allocator<_object_*>_>,_std::hash<const__object_*>,_std::equal_to<const__object_*>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>_>
           *)((long)pos.
                    super__Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
                    ._M_cur + 0x118),(iterator)local_28._M_cur);
  *(byte *)&self[3].ob_refcnt = (byte)self[3].ob_refcnt & 0xef;
  __end2 = std::vector<_object_*,_std::allocator<_object_*>_>::begin
                     ((vector<_object_*,_std::allocator<_object_*>_> *)local_48);
  patient = (PyObject **)
            std::vector<_object_*,_std::allocator<_object_*>_>::end
                      ((vector<_object_*,_std::allocator<_object_*>_> *)local_48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<_object_**,_std::vector<_object_*,_std::allocator<_object_*>_>_>
                                *)&patient);
    if (!bVar1) break;
    pp_Var3 = __gnu_cxx::
              __normal_iterator<_object_**,_std::vector<_object_*,_std::allocator<_object_*>_>_>::
              operator*(&__end2);
    op = *pp_Var3;
    if (op != (PyObject *)0x0) {
      *pp_Var3 = (_object *)0x0;
      _Py_DECREF(op);
    }
    __gnu_cxx::__normal_iterator<_object_**,_std::vector<_object_*,_std::allocator<_object_*>_>_>::
    operator++(&__end2);
  }
  std::vector<_object_*,_std::allocator<_object_*>_>::~vector
            ((vector<_object_*,_std::allocator<_object_*>_> *)local_48);
  return;
}

Assistant:

inline void clear_patients(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);
    auto &internals = get_internals();
    auto pos = internals.patients.find(self);
    assert(pos != internals.patients.end());
    // Clearing the patients can cause more Python code to run, which
    // can invalidate the iterator. Extract the vector of patients
    // from the unordered_map first.
    auto patients = std::move(pos->second);
    internals.patients.erase(pos);
    instance->has_patients = false;
    for (PyObject *&patient : patients)
        Py_CLEAR(patient);
}